

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::AST_Node>
chaiscript::
make_shared<chaiscript::AST_Node,chaiscript::eval::Single_Quoted_String_AST_Node,std::__cxx11::string,chaiscript::Parse_Location>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          Parse_Location *arg_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *in_RSI;
  element_type *in_RDI;
  shared_ptr<chaiscript::AST_Node> sVar1;
  Parse_Location *in_stack_00000010;
  string *in_stack_00000018;
  Single_Quoted_String_AST_Node *in_stack_00000020;
  element_type *this;
  string local_38 [40];
  string *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  operator_new(0x98);
  std::__cxx11::string::string(local_38,local_10);
  Parse_Location::Parse_Location((Parse_Location *)this,(Parse_Location *)in_RDI);
  eval::Single_Quoted_String_AST_Node::Single_Quoted_String_AST_Node
            (in_stack_00000020,in_stack_00000018,in_stack_00000010);
  std::shared_ptr<chaiscript::AST_Node>::shared_ptr<chaiscript::AST_Node,void>
            ((shared_ptr<chaiscript::AST_Node> *)this,in_RDI);
  Parse_Location::~Parse_Location((Parse_Location *)0x2467c7);
  std::__cxx11::string::~string(local_38);
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<chaiscript::AST_Node>)
         sVar1.super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg && ... arg)
  {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B*>(new D(std::forward<Arg>(arg)...)));
#endif
  }